

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  TestRunInfo *pTVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  Colour colour;
  Version local_38;
  
  local_38.majorVersion._0_1_ = 10;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase).stream,(char *)&local_38,1);
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam000000000016d9d0 = 0x7e7e7e7e7e7e7e;
    uRam000000000016d9d7 = 0x7e7e7e7e7e7e7e7e;
    _DAT_0016d9c0 = 0x7e7e7e7e7e7e7e7e;
    uRam000000000016d9c8 = 0x7e7e7e7e7e7e7e;
    DAT_0016d9cf = 0x7e;
    _DAT_0016d9b0 = 0x7e7e7e7e7e7e7e7e;
    uRam000000000016d9b8 = 0x7e7e7e7e7e7e7e7e;
    _DAT_0016d9a0 = 0x7e7e7e7e7e7e7e7e;
    uRam000000000016d9a8 = 0x7e7e7e7e7e7e7e7e;
    _line = 0x7e7e7e7e7e7e7e7e;
    uRam000000000016d998 = 0x7e7e7e7e7e7e7e7e;
    DAT_0016d9df = 0;
  }
  sVar4 = strlen(&getLineOfChars<(char)126>()::line);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,&getLineOfChars<(char)126>()::line,sVar4);
  local_38.majorVersion._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_38,1);
  Colour::use(FileName);
  pTVar1 = (this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
           nullableValue;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase).stream,(pTVar1->name)._M_dataplus._M_p,
                      (pTVar1->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is a Catch v",0xd);
  if (libraryVersion()::version == '\0') {
    lazyPrintRunInfo();
  }
  local_38.branchName = (char *)libraryVersion()::version._16_8_;
  local_38._24_8_ = libraryVersion()::version._24_8_;
  local_38.majorVersion = libraryVersion()::version._0_4_;
  local_38.minorVersion = libraryVersion()::version._4_4_;
  local_38._8_8_ = libraryVersion()::version._8_8_;
  operator<<(poVar3,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," host application.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Run with -? for options\n\n",0x19);
  iVar2 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xf])();
  if (iVar2 != 0) {
    poVar3 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Randomness seeded to: ",0x16);
    (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[0xf])();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\n",2);
  }
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::use(None);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << '\n' << getLineOfChars<'~'>() << '\n';
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion() << " host application.\n"
                    << "Run with -? for options\n\n";

            if( m_config->rngSeed() != 0 )
                stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

            currentTestRunInfo.used = true;
        }